

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint32_t helper_usat_arm(CPUARMState *env,uint32_t x,uint32_t shift)

{
  uint32_t uVar1;
  
  if ((int)x < 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = ~(-1 << ((byte)shift & 0x1f));
    if (x <= uVar1) {
      return x;
    }
  }
  env->QF = 1;
  return uVar1;
}

Assistant:

static inline uint32_t do_usat(CPUARMState *env, int32_t val, int shift)
{
    uint32_t max;

    max = (1u << shift) - 1;
    if (val < 0) {
        env->QF = 1;
        return 0;
    } else if (val > max) {
        env->QF = 1;
        return max;
    }
    return val;
}